

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
ReconnectIRCCommand::trigger
          (ReconnectIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view param_4)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char cVar3;
  ushort uVar4;
  DisconnectReason DVar5;
  long lVar6;
  ulong uVar7;
  undefined8 *puVar8;
  char *pcVar9;
  uint uVar10;
  size_type __dnew;
  size_type local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  IRC_Bot *local_60;
  size_t local_58;
  string local_50;
  
  pcVar9 = channel._M_str;
  local_58 = channel._M_len;
  local_60 = source;
  lVar6 = Jupiter::IRC::Client::getChannel(source,local_58,pcVar9,pcVar9,nick._M_len,nick._M_str);
  if (lVar6 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    uVar10 = 0;
    while( true ) {
      RenX::getCore();
      uVar7 = RenX::Core::getServerCount();
      if (uVar7 == uVar10) break;
      uVar7 = RenX::getCore();
      DVar5 = RenX::Core::getServer(uVar7);
      cVar3 = RenX::Server::isLogChanType(DVar5);
      if (cVar3 != '\0') {
        cVar3 = RenX::Server::reconnect(DVar5);
        if (cVar3 == '\0') {
          lVar6 = RenX::Server::getHostname_abi_cxx11_();
          uVar1 = *(undefined8 *)(lVar6 + 8);
          puVar8 = (undefined8 *)RenX::Server::getHostname_abi_cxx11_();
          uVar2 = *puVar8;
          uVar4 = RenX::Server::getPort();
          string_printf_abi_cxx11_
                    (&local_50,"[RenX] ERROR: Failed to connect to %.*s on port %u.\r\n",uVar1,uVar2
                     ,(ulong)uVar4);
          trigger();
        }
        else {
          local_a8 = 0x16;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          local_80._M_dataplus._M_p =
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_create(&local_80,&local_a8,0);
          local_80.field_2._M_allocated_capacity = local_a8;
          builtin_strncpy(local_80._M_dataplus._M_p,"Connection established",0x16);
          local_80._M_string_length = local_a8;
          local_80._M_dataplus._M_p[local_a8] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_a0,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        Jupiter::IRC::Client::sendMessage
                  (local_60,local_58,pcVar9,local_a0._M_string_length,local_a0._M_dataplus._M_p);
      }
      uVar10 = uVar10 + 1;
    }
    if (local_a0._M_string_length == 0) {
      local_a8 = 0x26;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      local_80._M_dataplus._M_p =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(&local_80,&local_a8,0);
      local_80.field_2._M_allocated_capacity = local_a8;
      builtin_strncpy(local_80._M_dataplus._M_p,"ERROR: No servers found to connect to.",0x26);
      local_80._M_string_length = local_a8;
      local_80._M_dataplus._M_p[local_a8] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_a0,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      Jupiter::IRC::Client::sendMessage
                (local_60,local_58,pcVar9,local_a0._M_string_length,local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void ReconnectIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view ) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		int type = chan->getType();
		std::string msg;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type)) {
				if (server->reconnect(RenX::DisconnectReason::Triggered)) {
					msg = "Connection established"s;
				}
				else {
					msg = string_printf("[RenX] ERROR: Failed to connect to %.*s on port %u." ENDL, server->getHostname().size(), server->getHostname().c_str(), server->getPort());
				}
				source->sendMessage(channel, msg);
			}
		}
		if (msg.empty()) {
			// We didn't connect anywhere!!
			msg = "ERROR: No servers found to connect to."s;
			source->sendMessage(channel, msg);
		}
	}
}